

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall QSslSocket::setSslConfiguration(QSslSocket *this,QSslConfiguration *configuration)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  PeerVerifyMode PVar4;
  SslProtocol SVar5;
  NextProtocolNegotiationStatus NVar6;
  QSslSocketPrivate *other;
  QSslConfigurationPrivate *pQVar7;
  QList<QByteArray> *in_RSI;
  QSslConfiguration *in_RDI;
  long in_FS_OFFSET;
  QSslSocketPrivate *d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  other = d_func((QSslSocket *)0x3a1f20);
  QSslConfiguration::localCertificateChain(in_RDI);
  QList<QSslCertificate>::operator=
            ((QList<QSslCertificate> *)in_RSI,(QList<QSslCertificate> *)other);
  QList<QSslCertificate>::~QList((QList<QSslCertificate> *)0x3a1f5f);
  QSslConfiguration::privateKey(in_RDI);
  QSslKey::operator=((QSslKey *)in_RDI,(QSslKey *)in_RSI);
  QSslKey::~QSslKey((QSslKey *)0x3a1f9a);
  QSslConfiguration::ciphers(in_RDI);
  QList<QSslCipher>::operator=((QList<QSslCipher> *)in_RSI,(QList<QSslCipher> *)other);
  QList<QSslCipher>::~QList((QList<QSslCipher> *)0x3a1fd5);
  QSslConfiguration::ellipticCurves(in_RDI);
  QList<QSslEllipticCurve>::operator=
            ((QList<QSslEllipticCurve> *)in_RSI,(QList<QSslEllipticCurve> *)other);
  QList<QSslEllipticCurve>::~QList((QList<QSslEllipticCurve> *)0x3a2013);
  QSslConfiguration::preSharedKeyIdentityHint(in_RDI);
  QByteArray::operator=((QByteArray *)in_RSI,(QByteArray *)other);
  QByteArray::~QByteArray((QByteArray *)0x3a2051);
  QSslConfiguration::diffieHellmanParameters(in_RDI);
  QSslDiffieHellmanParameters::operator=
            ((QSslDiffieHellmanParameters *)in_RSI,(QSslDiffieHellmanParameters *)other);
  QSslDiffieHellmanParameters::~QSslDiffieHellmanParameters((QSslDiffieHellmanParameters *)in_RSI);
  QSslConfiguration::caCertificates(in_RDI);
  QList<QSslCertificate>::operator=
            ((QList<QSslCertificate> *)in_RSI,(QList<QSslCertificate> *)other);
  QList<QSslCertificate>::~QList((QList<QSslCertificate> *)0x3a20c1);
  iVar3 = QSslConfiguration::peerVerifyDepth((QSslConfiguration *)0x3a20cb);
  (other->configuration).peerVerifyDepth = iVar3;
  PVar4 = QSslConfiguration::peerVerifyMode((QSslConfiguration *)0x3a20e1);
  (other->configuration).peerVerifyMode = PVar4;
  SVar5 = QSslConfiguration::protocol((QSslConfiguration *)0x3a20f7);
  (other->configuration).protocol = SVar5;
  QSslConfiguration::backendConfiguration(in_RDI);
  QMap<QByteArray,_QVariant>::operator=
            ((QMap<QByteArray,_QVariant> *)in_RSI,(QMap<QByteArray,_QVariant> *)other);
  QMap<QByteArray,_QVariant>::~QMap((QMap<QByteArray,_QVariant> *)0x3a2138);
  pQVar7 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                     ((QSharedDataPointer<QSslConfigurationPrivate> *)0x3a2142);
  (other->configuration).sslOptions.super_QFlagsStorageHelper<QSsl::SslOption,_4>.
  super_QFlagsStorage<QSsl::SslOption>.i =
       (pQVar7->sslOptions).super_QFlagsStorageHelper<QSsl::SslOption,_4>.
       super_QFlagsStorage<QSsl::SslOption>.i;
  QSslConfiguration::sessionTicket(in_RDI);
  QByteArray::operator=((QByteArray *)in_RSI,(QByteArray *)other);
  QByteArray::~QByteArray((QByteArray *)0x3a218a);
  iVar3 = QSslConfiguration::sessionTicketLifeTimeHint((QSslConfiguration *)0x3a2194);
  (other->configuration).sslSessionTicketLifeTimeHint = iVar3;
  QSslConfiguration::allowedNextProtocols(in_RDI);
  QList<QByteArray>::operator=(in_RSI,(QList<QByteArray> *)other);
  QList<QByteArray>::~QList((QList<QByteArray> *)0x3a21d5);
  QSslConfiguration::nextNegotiatedProtocol(in_RDI);
  QByteArray::operator=((QByteArray *)in_RSI,(QByteArray *)other);
  QByteArray::~QByteArray((QByteArray *)0x3a220a);
  NVar6 = QSslConfiguration::nextProtocolNegotiationStatus((QSslConfiguration *)0x3a2214);
  (other->configuration).nextProtocolNegotiationStatus = NVar6;
  bVar2 = QSslConfiguration::ocspStaplingEnabled((QSslConfiguration *)0x3a222a);
  (other->configuration).ocspStaplingEnabled = bVar2;
  bVar2 = QSslConfiguration::handshakeMustInterruptOnError((QSslConfiguration *)0x3a2243);
  (other->configuration).reportFromCallback = bVar2;
  bVar2 = QSslConfiguration::missingCertificateIsFatal((QSslConfiguration *)0x3a225c);
  (other->configuration).missingCertIsFatal = bVar2;
  pQVar7 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                     ((QSharedDataPointer<QSslConfigurationPrivate> *)0x3a2275);
  if ((pQVar7->allowRootCertOnDemandLoading & 1U) == 0) {
    other->allowRootCertOnDemandLoading = false;
    (other->configuration).allowRootCertOnDemandLoading = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocket::setSslConfiguration(const QSslConfiguration &configuration)
{
    Q_D(QSslSocket);
    d->configuration.localCertificateChain = configuration.localCertificateChain();
    d->configuration.privateKey = configuration.privateKey();
    d->configuration.ciphers = configuration.ciphers();
    d->configuration.ellipticCurves = configuration.ellipticCurves();
    d->configuration.preSharedKeyIdentityHint = configuration.preSharedKeyIdentityHint();
    d->configuration.dhParams = configuration.diffieHellmanParameters();
    d->configuration.caCertificates = configuration.caCertificates();
    d->configuration.peerVerifyDepth = configuration.peerVerifyDepth();
    d->configuration.peerVerifyMode = configuration.peerVerifyMode();
    d->configuration.protocol = configuration.protocol();
    d->configuration.backendConfig = configuration.backendConfiguration();
    d->configuration.sslOptions = configuration.d->sslOptions;
    d->configuration.sslSession = configuration.sessionTicket();
    d->configuration.sslSessionTicketLifeTimeHint = configuration.sessionTicketLifeTimeHint();
    d->configuration.nextAllowedProtocols = configuration.allowedNextProtocols();
    d->configuration.nextNegotiatedProtocol = configuration.nextNegotiatedProtocol();
    d->configuration.nextProtocolNegotiationStatus = configuration.nextProtocolNegotiationStatus();
#if QT_CONFIG(ocsp)
    d->configuration.ocspStaplingEnabled = configuration.ocspStaplingEnabled();
#endif
#if QT_CONFIG(openssl)
    d->configuration.reportFromCallback = configuration.handshakeMustInterruptOnError();
    d->configuration.missingCertIsFatal = configuration.missingCertificateIsFatal();
#endif // openssl
    // if the CA certificates were set explicitly (either via
    // QSslConfiguration::setCaCertificates() or QSslSocket::setCaCertificates(),
    // we cannot load the certificates on demand
    if (!configuration.d->allowRootCertOnDemandLoading) {
        d->allowRootCertOnDemandLoading = false;
        d->configuration.allowRootCertOnDemandLoading = false;
    }
}